

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall
Tokenizer::registerReplacementInteger(Tokenizer *this,Identifier *identifier,int64_t newValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Replacement replacement;
  Token tok;
  value_type local_f8;
  string local_c0;
  int64_t local_a0;
  undefined1 local_98 [64];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_98[0x38] = '\0';
  local_98[0x14] = false;
  local_98._0_8_ = 0;
  local_98._8_5_ = 0;
  local_98._13_3_ = 0;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_98._16_4_ = Integer;
  local_a0 = newValue;
  local_58._M_p = (pointer)&local_48;
  tinyformat::format<long>(&local_c0,"%d",&local_a0);
  local_f8.identifier._name._M_dataplus._M_p = (pointer)newValue;
  std::variant<std::monostate,long,double,StringLiteral,Identifier>::operator=
            ((variant<std::monostate,long,double,StringLiteral,Identifier> *)(local_98 + 0x18),
             (long *)&local_f8);
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_f8.identifier._name.field_2;
  local_f8.identifier._name._M_string_length = 0;
  local_f8.identifier._name.field_2._M_local_buf[0] = '\0';
  local_f8.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.identifier._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_assign((string *)&local_f8);
  std::vector<Token,_std::allocator<Token>_>::push_back(&local_f8.value,(value_type *)local_98);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&local_f8);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_f8.value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.identifier._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.identifier._name._M_dataplus._M_p,
                    CONCAT71(local_f8.identifier._name.field_2._M_allocated_capacity._1_7_,
                             local_f8.identifier._name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)(local_98 + 0x18));
  return;
}

Assistant:

void Tokenizer::registerReplacementInteger(const Identifier& identifier, int64_t newValue)
{
	Token tok;
	tok.type = TokenType::Integer;
	tok.setValue(newValue, tfm::format("%d", newValue));

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}